

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_segment.cpp
# Opt level: O3

void __thiscall
duckdb::FilterSelectionSwitch<duckdb::string_t>
          (duckdb *this,UnifiedVectorFormat *vdata,string_t predicate,SelectionVector *sel,
          idx_t *approved_tuple_count,ExpressionType comparison_type)

{
  sel_t *psVar1;
  long lVar2;
  bool bVar3;
  ulong uVar4;
  NotImplementedException *this_00;
  long *plVar5;
  char *pcVar6;
  sel_t *psVar7;
  sel_t *psVar8;
  sel_t *psVar9;
  sel_t *psVar10;
  SelectionVector new_sel;
  anon_union_16_2_67f50693_for_value local_70;
  undefined1 local_60 [16];
  SelectionVector local_50;
  SelectionVector *local_38;
  
  plVar5 = predicate.value._8_8_;
  pcVar6 = predicate.value._0_8_;
  SelectionVector::SelectionVector(&local_50,(idx_t)sel->sel_vector);
  local_70._0_8_ = vdata;
  local_70.pointer.ptr = pcVar6;
  local_38 = sel;
  switch((int)approved_tuple_count) {
  case 0x19:
    psVar1 = sel->sel_vector;
    if (*(long *)(this + 0x10) == 0) {
      if (psVar1 != (sel_t *)0x0) {
        lVar2 = *(long *)(this + 8);
        psVar9 = (sel_t *)0x0;
        psVar8 = (sel_t *)0x0;
        do {
          psVar10 = psVar8;
          if (*plVar5 != 0) {
            psVar10 = (sel_t *)(ulong)*(uint *)(*plVar5 + (long)psVar8 * 4);
          }
          psVar7 = psVar10;
          if (**(long **)this != 0) {
            psVar7 = (sel_t *)(ulong)*(uint *)(**(long **)this + (long)psVar10 * 4);
          }
          bVar3 = string_t::operator==
                            ((string_t *)((long)psVar7 * 0x10 + lVar2),(string_t *)&local_70.pointer
                            );
          local_50.sel_vector[(long)psVar9] = (sel_t)psVar10;
          psVar9 = (sel_t *)((long)psVar9 + (ulong)bVar3);
          psVar8 = (sel_t *)((long)psVar8 + 1);
        } while (psVar1 != psVar8);
        goto LAB_01782ef7;
      }
    }
    else if (psVar1 != (sel_t *)0x0) {
      lVar2 = *(long *)(this + 8);
      psVar9 = (sel_t *)0x0;
      psVar8 = (sel_t *)0x0;
      do {
        psVar10 = psVar8;
        if (*plVar5 != 0) {
          psVar10 = (sel_t *)(ulong)*(uint *)(*plVar5 + (long)psVar8 * 4);
        }
        psVar7 = psVar10;
        if (**(long **)this != 0) {
          psVar7 = (sel_t *)(ulong)*(uint *)(**(long **)this + (long)psVar10 * 4);
        }
        if ((*(long *)(this + 0x10) == 0) ||
           ((*(ulong *)(*(long *)(this + 0x10) + ((ulong)psVar7 >> 6) * 8) >> ((ulong)psVar7 & 0x3f)
            & 1) != 0)) {
          bVar3 = string_t::operator==
                            ((string_t *)((long)psVar7 * 0x10 + lVar2),(string_t *)&local_70.pointer
                            );
          uVar4 = (ulong)bVar3;
        }
        else {
          uVar4 = 0;
        }
        local_50.sel_vector[(long)psVar9] = (sel_t)psVar10;
        psVar9 = (sel_t *)((long)psVar9 + uVar4);
        psVar8 = (sel_t *)((long)psVar8 + 1);
      } while (psVar1 != psVar8);
      goto LAB_01782ef7;
    }
    break;
  case 0x1a:
    psVar1 = sel->sel_vector;
    if (*(long *)(this + 0x10) == 0) {
      if (psVar1 != (sel_t *)0x0) {
        lVar2 = *(long *)(this + 8);
        psVar9 = (sel_t *)0x0;
        psVar8 = (sel_t *)0x0;
        do {
          psVar10 = psVar8;
          if (*plVar5 != 0) {
            psVar10 = (sel_t *)(ulong)*(uint *)(*plVar5 + (long)psVar8 * 4);
          }
          psVar7 = psVar10;
          if (**(long **)this != 0) {
            psVar7 = (sel_t *)(ulong)*(uint *)(**(long **)this + (long)psVar10 * 4);
          }
          bVar3 = string_t::operator==
                            ((string_t *)((long)psVar7 * 0x10 + lVar2),(string_t *)&local_70.pointer
                            );
          local_50.sel_vector[(long)psVar9] = (sel_t)psVar10;
          psVar9 = (sel_t *)((long)psVar9 + (ulong)!bVar3);
          psVar8 = (sel_t *)((long)psVar8 + 1);
        } while (psVar1 != psVar8);
        goto LAB_01782ef7;
      }
    }
    else if (psVar1 != (sel_t *)0x0) {
      lVar2 = *(long *)(this + 8);
      psVar9 = (sel_t *)0x0;
      psVar8 = (sel_t *)0x0;
      do {
        psVar10 = psVar8;
        if (*plVar5 != 0) {
          psVar10 = (sel_t *)(ulong)*(uint *)(*plVar5 + (long)psVar8 * 4);
        }
        psVar7 = psVar10;
        if (**(long **)this != 0) {
          psVar7 = (sel_t *)(ulong)*(uint *)(**(long **)this + (long)psVar10 * 4);
        }
        if ((*(long *)(this + 0x10) == 0) ||
           ((*(ulong *)(*(long *)(this + 0x10) + ((ulong)psVar7 >> 6) * 8) >> ((ulong)psVar7 & 0x3f)
            & 1) != 0)) {
          bVar3 = string_t::operator==
                            ((string_t *)((long)psVar7 * 0x10 + lVar2),(string_t *)&local_70.pointer
                            );
          uVar4 = (ulong)!bVar3;
        }
        else {
          uVar4 = 0;
        }
        local_50.sel_vector[(long)psVar9] = (sel_t)psVar10;
        psVar9 = (sel_t *)((long)psVar9 + uVar4);
        psVar8 = (sel_t *)((long)psVar8 + 1);
      } while (psVar1 != psVar8);
      goto LAB_01782ef7;
    }
    break;
  case 0x1b:
    psVar1 = sel->sel_vector;
    if (*(long *)(this + 0x10) == 0) {
      if (psVar1 != (sel_t *)0x0) {
        lVar2 = *(long *)(this + 8);
        psVar9 = (sel_t *)0x0;
        psVar8 = (sel_t *)0x0;
        do {
          psVar10 = psVar8;
          if (*plVar5 != 0) {
            psVar10 = (sel_t *)(ulong)*(uint *)(*plVar5 + (long)psVar8 * 4);
          }
          psVar7 = psVar10;
          if (**(long **)this != 0) {
            psVar7 = (sel_t *)(ulong)*(uint *)(**(long **)this + (long)psVar10 * 4);
          }
          bVar3 = string_t::StringComparisonOperators::GreaterThan
                            ((string_t *)&local_70.pointer,(string_t *)((long)psVar7 * 0x10 + lVar2)
                            );
          local_50.sel_vector[(long)psVar9] = (sel_t)psVar10;
          psVar9 = (sel_t *)((long)psVar9 + (ulong)bVar3);
          psVar8 = (sel_t *)((long)psVar8 + 1);
        } while (psVar1 != psVar8);
        goto LAB_01782ef7;
      }
    }
    else if (psVar1 != (sel_t *)0x0) {
      lVar2 = *(long *)(this + 8);
      psVar9 = (sel_t *)0x0;
      psVar8 = (sel_t *)0x0;
      do {
        psVar10 = psVar8;
        if (*plVar5 != 0) {
          psVar10 = (sel_t *)(ulong)*(uint *)(*plVar5 + (long)psVar8 * 4);
        }
        psVar7 = psVar10;
        if (**(long **)this != 0) {
          psVar7 = (sel_t *)(ulong)*(uint *)(**(long **)this + (long)psVar10 * 4);
        }
        if ((*(long *)(this + 0x10) == 0) ||
           ((*(ulong *)(*(long *)(this + 0x10) + ((ulong)psVar7 >> 6) * 8) >> ((ulong)psVar7 & 0x3f)
            & 1) != 0)) {
          bVar3 = string_t::StringComparisonOperators::GreaterThan
                            ((string_t *)&local_70.pointer,(string_t *)((long)psVar7 * 0x10 + lVar2)
                            );
          uVar4 = (ulong)bVar3;
        }
        else {
          uVar4 = 0;
        }
        local_50.sel_vector[(long)psVar9] = (sel_t)psVar10;
        psVar9 = (sel_t *)((long)psVar9 + uVar4);
        psVar8 = (sel_t *)((long)psVar8 + 1);
      } while (psVar1 != psVar8);
      goto LAB_01782ef7;
    }
    break;
  case 0x1c:
    psVar1 = sel->sel_vector;
    if (*(long *)(this + 0x10) == 0) {
      if (psVar1 != (sel_t *)0x0) {
        lVar2 = *(long *)(this + 8);
        psVar9 = (sel_t *)0x0;
        psVar8 = (sel_t *)0x0;
        do {
          psVar10 = psVar8;
          if (*plVar5 != 0) {
            psVar10 = (sel_t *)(ulong)*(uint *)(*plVar5 + (long)psVar8 * 4);
          }
          psVar7 = psVar10;
          if (**(long **)this != 0) {
            psVar7 = (sel_t *)(ulong)*(uint *)(**(long **)this + (long)psVar10 * 4);
          }
          bVar3 = string_t::StringComparisonOperators::GreaterThan
                            ((string_t *)((long)psVar7 * 0x10 + lVar2),(string_t *)&local_70.pointer
                            );
          local_50.sel_vector[(long)psVar9] = (sel_t)psVar10;
          psVar9 = (sel_t *)((long)psVar9 + (ulong)bVar3);
          psVar8 = (sel_t *)((long)psVar8 + 1);
        } while (psVar1 != psVar8);
        goto LAB_01782ef7;
      }
    }
    else if (psVar1 != (sel_t *)0x0) {
      lVar2 = *(long *)(this + 8);
      psVar9 = (sel_t *)0x0;
      psVar8 = (sel_t *)0x0;
      do {
        psVar10 = psVar8;
        if (*plVar5 != 0) {
          psVar10 = (sel_t *)(ulong)*(uint *)(*plVar5 + (long)psVar8 * 4);
        }
        psVar7 = psVar10;
        if (**(long **)this != 0) {
          psVar7 = (sel_t *)(ulong)*(uint *)(**(long **)this + (long)psVar10 * 4);
        }
        if ((*(long *)(this + 0x10) == 0) ||
           ((*(ulong *)(*(long *)(this + 0x10) + ((ulong)psVar7 >> 6) * 8) >> ((ulong)psVar7 & 0x3f)
            & 1) != 0)) {
          bVar3 = string_t::StringComparisonOperators::GreaterThan
                            ((string_t *)((long)psVar7 * 0x10 + lVar2),(string_t *)&local_70.pointer
                            );
          uVar4 = (ulong)bVar3;
        }
        else {
          uVar4 = 0;
        }
        local_50.sel_vector[(long)psVar9] = (sel_t)psVar10;
        psVar9 = (sel_t *)((long)psVar9 + uVar4);
        psVar8 = (sel_t *)((long)psVar8 + 1);
      } while (psVar1 != psVar8);
      goto LAB_01782ef7;
    }
    break;
  case 0x1d:
    psVar1 = sel->sel_vector;
    if (*(long *)(this + 0x10) == 0) {
      if (psVar1 != (sel_t *)0x0) {
        lVar2 = *(long *)(this + 8);
        psVar9 = (sel_t *)0x0;
        psVar8 = (sel_t *)0x0;
        do {
          psVar10 = psVar8;
          if (*plVar5 != 0) {
            psVar10 = (sel_t *)(ulong)*(uint *)(*plVar5 + (long)psVar8 * 4);
          }
          psVar7 = psVar10;
          if (**(long **)this != 0) {
            psVar7 = (sel_t *)(ulong)*(uint *)(**(long **)this + (long)psVar10 * 4);
          }
          bVar3 = string_t::StringComparisonOperators::GreaterThan
                            ((string_t *)((long)psVar7 * 0x10 + lVar2),(string_t *)&local_70.pointer
                            );
          local_50.sel_vector[(long)psVar9] = (sel_t)psVar10;
          psVar9 = (sel_t *)((long)psVar9 + (ulong)!bVar3);
          psVar8 = (sel_t *)((long)psVar8 + 1);
        } while (psVar1 != psVar8);
        goto LAB_01782ef7;
      }
    }
    else if (psVar1 != (sel_t *)0x0) {
      lVar2 = *(long *)(this + 8);
      psVar9 = (sel_t *)0x0;
      psVar8 = (sel_t *)0x0;
      do {
        psVar10 = psVar8;
        if (*plVar5 != 0) {
          psVar10 = (sel_t *)(ulong)*(uint *)(*plVar5 + (long)psVar8 * 4);
        }
        psVar7 = psVar10;
        if (**(long **)this != 0) {
          psVar7 = (sel_t *)(ulong)*(uint *)(**(long **)this + (long)psVar10 * 4);
        }
        if ((*(long *)(this + 0x10) == 0) ||
           ((*(ulong *)(*(long *)(this + 0x10) + ((ulong)psVar7 >> 6) * 8) >> ((ulong)psVar7 & 0x3f)
            & 1) != 0)) {
          bVar3 = string_t::StringComparisonOperators::GreaterThan
                            ((string_t *)((long)psVar7 * 0x10 + lVar2),(string_t *)&local_70.pointer
                            );
          uVar4 = (ulong)!bVar3;
        }
        else {
          uVar4 = 0;
        }
        local_50.sel_vector[(long)psVar9] = (sel_t)psVar10;
        psVar9 = (sel_t *)((long)psVar9 + uVar4);
        psVar8 = (sel_t *)((long)psVar8 + 1);
      } while (psVar1 != psVar8);
      goto LAB_01782ef7;
    }
    break;
  case 0x1e:
    psVar1 = sel->sel_vector;
    if (*(long *)(this + 0x10) == 0) {
      if (psVar1 != (sel_t *)0x0) {
        lVar2 = *(long *)(this + 8);
        psVar9 = (sel_t *)0x0;
        psVar8 = (sel_t *)0x0;
        do {
          psVar10 = psVar8;
          if (*plVar5 != 0) {
            psVar10 = (sel_t *)(ulong)*(uint *)(*plVar5 + (long)psVar8 * 4);
          }
          psVar7 = psVar10;
          if (**(long **)this != 0) {
            psVar7 = (sel_t *)(ulong)*(uint *)(**(long **)this + (long)psVar10 * 4);
          }
          bVar3 = string_t::StringComparisonOperators::GreaterThan
                            ((string_t *)&local_70.pointer,(string_t *)((long)psVar7 * 0x10 + lVar2)
                            );
          local_50.sel_vector[(long)psVar9] = (sel_t)psVar10;
          psVar9 = (sel_t *)((long)psVar9 + (ulong)!bVar3);
          psVar8 = (sel_t *)((long)psVar8 + 1);
        } while (psVar1 != psVar8);
        goto LAB_01782ef7;
      }
    }
    else if (psVar1 != (sel_t *)0x0) {
      lVar2 = *(long *)(this + 8);
      psVar9 = (sel_t *)0x0;
      psVar8 = (sel_t *)0x0;
      do {
        psVar10 = psVar8;
        if (*plVar5 != 0) {
          psVar10 = (sel_t *)(ulong)*(uint *)(*plVar5 + (long)psVar8 * 4);
        }
        psVar7 = psVar10;
        if (**(long **)this != 0) {
          psVar7 = (sel_t *)(ulong)*(uint *)(**(long **)this + (long)psVar10 * 4);
        }
        if ((*(long *)(this + 0x10) == 0) ||
           ((*(ulong *)(*(long *)(this + 0x10) + ((ulong)psVar7 >> 6) * 8) >> ((ulong)psVar7 & 0x3f)
            & 1) != 0)) {
          bVar3 = string_t::StringComparisonOperators::GreaterThan
                            ((string_t *)&local_70.pointer,(string_t *)((long)psVar7 * 0x10 + lVar2)
                            );
          uVar4 = (ulong)!bVar3;
        }
        else {
          uVar4 = 0;
        }
        local_50.sel_vector[(long)psVar9] = (sel_t)psVar10;
        psVar9 = (sel_t *)((long)psVar9 + uVar4);
        psVar8 = (sel_t *)((long)psVar8 + 1);
      } while (psVar1 != psVar8);
      goto LAB_01782ef7;
    }
    break;
  default:
    this_00 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_70._0_8_ = local_60;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,"Unknown comparison type for filter pushed down to table!","");
    NotImplementedException::NotImplementedException(this_00,(string *)&local_70.pointer);
    __cxa_throw(this_00,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  }
  psVar9 = (sel_t *)0x0;
LAB_01782ef7:
  local_38->sel_vector = psVar9;
  shared_ptr<duckdb::SelectionData,_true>::operator=
            ((shared_ptr<duckdb::SelectionData,_true> *)(plVar5 + 1),&local_50.selection_data);
  *plVar5 = (long)local_50.sel_vector;
  if (local_50.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_50.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  return;
}

Assistant:

static void FilterSelectionSwitch(UnifiedVectorFormat &vdata, T predicate, SelectionVector &sel,
                                  idx_t &approved_tuple_count, ExpressionType comparison_type) {
	SelectionVector new_sel(approved_tuple_count);
	auto &mask = vdata.validity;
	// the inplace loops take the result as the last parameter
	switch (comparison_type) {
	case ExpressionType::COMPARE_EQUAL: {
		if (mask.AllValid()) {
			approved_tuple_count =
			    TemplatedFilterSelection<T, Equals, false>(vdata, predicate, sel, approved_tuple_count, new_sel);
		} else {
			approved_tuple_count =
			    TemplatedFilterSelection<T, Equals, true>(vdata, predicate, sel, approved_tuple_count, new_sel);
		}
		break;
	}
	case ExpressionType::COMPARE_NOTEQUAL: {
		if (mask.AllValid()) {
			approved_tuple_count =
			    TemplatedFilterSelection<T, NotEquals, false>(vdata, predicate, sel, approved_tuple_count, new_sel);
		} else {
			approved_tuple_count =
			    TemplatedFilterSelection<T, NotEquals, true>(vdata, predicate, sel, approved_tuple_count, new_sel);
		}
		break;
	}
	case ExpressionType::COMPARE_LESSTHAN: {
		if (mask.AllValid()) {
			approved_tuple_count =
			    TemplatedFilterSelection<T, LessThan, false>(vdata, predicate, sel, approved_tuple_count, new_sel);
		} else {
			approved_tuple_count =
			    TemplatedFilterSelection<T, LessThan, true>(vdata, predicate, sel, approved_tuple_count, new_sel);
		}
		break;
	}
	case ExpressionType::COMPARE_GREATERTHAN: {
		if (mask.AllValid()) {
			approved_tuple_count =
			    TemplatedFilterSelection<T, GreaterThan, false>(vdata, predicate, sel, approved_tuple_count, new_sel);
		} else {
			approved_tuple_count =
			    TemplatedFilterSelection<T, GreaterThan, true>(vdata, predicate, sel, approved_tuple_count, new_sel);
		}
		break;
	}
	case ExpressionType::COMPARE_LESSTHANOREQUALTO: {
		if (mask.AllValid()) {
			approved_tuple_count = TemplatedFilterSelection<T, LessThanEquals, false>(vdata, predicate, sel,
			                                                                          approved_tuple_count, new_sel);
		} else {
			approved_tuple_count =
			    TemplatedFilterSelection<T, LessThanEquals, true>(vdata, predicate, sel, approved_tuple_count, new_sel);
		}
		break;
	}
	case ExpressionType::COMPARE_GREATERTHANOREQUALTO: {
		if (mask.AllValid()) {
			approved_tuple_count = TemplatedFilterSelection<T, GreaterThanEquals, false>(vdata, predicate, sel,
			                                                                             approved_tuple_count, new_sel);
		} else {
			approved_tuple_count = TemplatedFilterSelection<T, GreaterThanEquals, true>(vdata, predicate, sel,
			                                                                            approved_tuple_count, new_sel);
		}
		break;
	}
	default:
		throw NotImplementedException("Unknown comparison type for filter pushed down to table!");
	}
	sel.Initialize(new_sel);
}